

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundParser.cpp
# Opt level: O3

void __thiscall
BackgroundParser::RemoveFromUnprocessedItems(BackgroundParser *this,BackgroundParseItem *item)

{
  BackgroundParseItem *pBVar1;
  BackgroundParseItem **ppBVar2;
  
  if (this->unprocessedItemsHead == item) {
    pBVar1 = item->nextUnprocessedItem;
    this->unprocessedItemsHead = pBVar1;
  }
  else {
    pBVar1 = item->nextUnprocessedItem;
    item->prevUnprocessedItem->nextUnprocessedItem = pBVar1;
  }
  ppBVar2 = &pBVar1->prevUnprocessedItem;
  if (this->unprocessedItemsTail == item) {
    ppBVar2 = &this->unprocessedItemsTail;
  }
  *ppBVar2 = item->prevUnprocessedItem;
  item->nextUnprocessedItem = (BackgroundParseItem *)0x0;
  item->prevUnprocessedItem = (BackgroundParseItem *)0x0;
  return;
}

Assistant:

void BackgroundParser::RemoveFromUnprocessedItems(BackgroundParseItem *const item)
{
    if (this->unprocessedItemsHead == item)
    {
        this->unprocessedItemsHead = item->GetNextUnprocessedItem();
    }
    else
    {
        item->GetPrevUnprocessedItem()->SetNextUnprocessedItem(item->GetNextUnprocessedItem());
    }
    if (this->unprocessedItemsTail == item)
    {
        this->unprocessedItemsTail = item->GetPrevUnprocessedItem();
    }
    else
    {
        item->GetNextUnprocessedItem()->SetPrevUnprocessedItem(item->GetPrevUnprocessedItem());
    }
    item->SetNextUnprocessedItem(nullptr);
    item->SetPrevUnprocessedItem(nullptr);
}